

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall
QDateTimeEditPrivate::updateCache(QDateTimeEditPrivate *this,QVariant *val,QString *str)

{
  char16_t *pcVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  State unusedState;
  int unused;
  undefined1 local_50 [24];
  char16_t *local_38;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = ::QVariant::equals(val);
  pcVar1 = (str->d).ptr;
  lVar2 = (str->d).size;
  if ((cVar3 != '\0') && (lVar2 == (this->super_QAbstractSpinBoxPrivate).cachedText.d.size)) {
    QVar4.m_data = pcVar1;
    QVar4.m_size = lVar2;
    QVar5.m_data = (this->super_QAbstractSpinBoxPrivate).cachedText.d.ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if ((cVar3 != '\0') && (this->cacheGuard != true)) goto LAB_003e46f5;
  }
  this->cacheGuard = true;
  local_50._16_8_ = (str->d).d;
  if ((QArrayData *)local_50._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_50._16_8_)->ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((QArrayData *)local_50._16_8_)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = pcVar1;
  local_30 = lVar2;
  local_50._12_4_ = QLineEdit::cursorPosition((this->super_QAbstractSpinBoxPrivate).edit);
  local_50._8_4_ = 0xaaaaaaaa;
  validateAndInterpret
            ((QDateTimeEditPrivate *)local_50,(QString *)this,(int *)(local_50 + 0x10),
             (State *)(local_50 + 0xc),(bool)((char)local_50 + '\b'));
  QDateTime::~QDateTime((QDateTime *)local_50);
  this->cacheGuard = false;
  if ((QArrayData *)local_50._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_50._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_50._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_50._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50._16_8_,2,0x10);
    }
  }
LAB_003e46f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateCache(const QVariant &val, const QString &str) const
{
    if (val != cachedValue || str != cachedText || cacheGuard) {
        cacheGuard = true;
        QString copy = str;
        int unused = edit->cursorPosition();
        QValidator::State unusedState;
        validateAndInterpret(copy, unused, unusedState);
        cacheGuard = false;
    }
}